

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCone.c
# Opt level: O0

Gia_Man_t *
Gia_ManFindPoPartition3
          (Gia_Man_t *p,int iOut,int nDelta,int nOutsMin,int nOutsMax,int fVerbose,
          Vec_Ptr_t **pvPosEquivs)

{
  int fVerbose_local;
  int nOutsMax_local;
  int nOutsMin_local;
  int nDelta_local;
  int iOut_local;
  Gia_Man_t *p_local;
  
  return (Gia_Man_t *)0x0;
}

Assistant:

Gia_Man_t * Gia_ManFindPoPartition3( Gia_Man_t * p, int iOut, int nDelta, int nOutsMin, int nOutsMax, int fVerbose, Vec_Ptr_t ** pvPosEquivs )
{
/*
    int i, Count = 0;
    // mark nodes belonging to output 'iOut'
    for ( i = 0; i < Gia_ManPoNum(p); i++ )
        Count += (Gia_ManConeMark(p, i, 10000) < 10000);
     //   printf( "%d ", Gia_ManConeMark(p, i, 1000) );
    printf( "%d out of %d\n", Count, Gia_ManPoNum(p) );

    // add other outputs as long as they are nDelta away
*/
//    Opa_ManPerform( p );

    return NULL;
}